

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_blob_detection.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint32_t x;
  char *__s;
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint8_t uVar7;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar8;
  BlobInfo *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  imageException *this_00;
  size_t i;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  string filePath;
  BlobDetection detection;
  Image local_178;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint8_t local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  BlobDetection local_e8;
  undefined1 local_c8 [64];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"mercury.bmp","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_108,0,(char *)local_108._M_string_length,(ulong)__s);
  }
  Bitmap_Operation::Load(&local_178,&local_108);
  if (local_178._data != (uchar *)0x0) {
    if (local_178._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)local_150,&local_178);
      uVar7 = local_130;
      uVar6 = local_140._M_allocated_capacity._4_4_;
      uVar4 = local_150._8_8_;
      puVar3 = local_178._data;
      uVar1 = local_178._16_2_;
      local_150._8_4_ = local_178._width;
      local_150._12_4_ = local_178._height;
      uVar5 = local_150._8_8_;
      local_150._8_4_ = (undefined4)uVar4;
      local_150._12_4_ = SUB84(uVar4,4);
      local_178._width = local_150._8_4_;
      local_178._height = local_150._12_4_;
      local_178._colorCount = local_140._M_local_buf[0];
      local_178._alignment = local_140._M_local_buf[1];
      uVar2 = local_178._16_2_;
      local_178._colorCount = (uint8_t)uVar1;
      local_178._alignment = SUB21(uVar1,1);
      local_140._M_local_buf[0] = local_178._colorCount;
      local_140._M_local_buf[1] = local_178._alignment;
      local_140._M_allocated_capacity._4_4_ = local_178._rowSize;
      local_178._rowSize = uVar6;
      local_178._data = (uchar *)local_140._8_8_;
      local_140._8_8_ = puVar3;
      local_130 = local_178._type;
      local_178._type = uVar7;
      local_150._0_8_ = &PTR__ImageTemplate_00124c30;
      local_178._16_2_ = uVar2;
      local_150._8_8_ = uVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_150)
      ;
    }
    Image_Function::Histogram
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128,&local_178);
    uVar7 = Image_Function::GetThreshold
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_128);
    Image_Function::Threshold((Image *)local_150,&local_178,uVar7);
    uVar7 = local_130;
    uVar6 = local_140._M_allocated_capacity._4_4_;
    uVar4 = local_150._8_8_;
    puVar3 = local_178._data;
    uVar1 = local_178._16_2_;
    local_150._8_4_ = local_178._width;
    local_150._12_4_ = local_178._height;
    uVar5 = local_150._8_8_;
    local_150._8_4_ = (undefined4)uVar4;
    local_150._12_4_ = SUB84(uVar4,4);
    local_178._width = local_150._8_4_;
    local_178._height = local_150._12_4_;
    local_178._colorCount = local_140._M_local_buf[0];
    local_178._alignment = local_140._M_local_buf[1];
    uVar2 = local_178._16_2_;
    local_178._colorCount = (uint8_t)uVar1;
    local_178._alignment = SUB21(uVar1,1);
    local_140._M_local_buf[0] = local_178._colorCount;
    local_140._M_local_buf[1] = local_178._alignment;
    local_140._M_allocated_capacity._4_4_ = local_178._rowSize;
    local_178._rowSize = uVar6;
    local_178._data = (uchar *)local_140._8_8_;
    local_140._8_8_ = puVar3;
    local_130 = local_178._type;
    local_150._0_8_ = &PTR__ImageTemplate_00124c30;
    local_178._type = uVar7;
    local_178._16_2_ = uVar2;
    local_150._8_8_ = uVar5;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_150);
    local_e8._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8 = ZEXT464(0) << 0x40;
    local_e8._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = 0;
    uStack_80 = 0;
    uStack_68 = 0;
    uStack_60 = 0;
    uStack_58 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    uStack_78 = local_88;
    uStack_70 = uStack_80;
    Blob_Detection::BlobDetection::find
              (&local_e8,&local_178,(BlobParameters)ZEXT72144(ZEXT872(0) << 0x40),'\x01');
    pvVar8 = Blob_Detection::BlobDetection::operator()(&local_e8);
    if ((pvVar8->
        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>).
        _M_impl.super__Vector_impl_data._M_start !=
        (pvVar8->
        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      this = Blob_Detection::BlobDetection::getBestBlob(&local_e8,CRITERION_SIZE);
      PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_178,'\0');
      uVar10 = 0;
      while( true ) {
        pvVar9 = Blob_Detection::BlobInfo::contourX(this);
        if ((ulong)((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar10) break;
        pvVar9 = Blob_Detection::BlobInfo::contourX(this);
        x = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10];
        pvVar9 = Blob_Detection::BlobInfo::contourY(this);
        Image_Function::SetPixel
                  (&local_178,x,
                   (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start[uVar10],0xff);
        uVar10 = uVar10 + 1;
      }
    }
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"result.bmp","");
    Bitmap_Operation::Save((string *)local_150,&local_178);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_);
    }
    std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
              (&local_e8._blob);
    if (local_128._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    local_178._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00124c30;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Application ended correctly.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    return 0;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Cannot load ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 &local_128,&local_108);
  imageException::imageException(this_00,(string *)local_150);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "mercury.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Search all possible blobs on image
        Blob_Detection::BlobDetection detection;
        detection.find( image );

        if ( !detection().empty() ) {
            // okay, our image contains some blobs
            // extract a biggest one
            const Blob_Detection::BlobInfo & blob = detection.getBestBlob( Blob_Detection::BlobDetection::CRITERION_SIZE );

            // clear image and draw contour of found blob
            image.fill( 0 );

            for ( size_t i = 0; i < blob.contourX().size(); ++i )
                Image_Function::SetPixel( image, blob.contourX()[i], blob.contourY()[i], 255u );
        }

        // Save result into file
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}